

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int av1_calc_refresh_idx_for_intnl_arf
              (AV1_COMP *cpi,RefFrameMapPair *ref_frame_map_pairs,int gf_index)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  RefFrameMapPair *in_RSI;
  long *in_RDI;
  int refresh_idx;
  int enable_refresh_skip;
  int free_fb_index;
  GF_GROUP *gf_group;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  lVar1 = *in_RDI;
  local_4 = get_free_ref_map_index(in_RSI);
  if (local_4 == -1) {
    iVar2 = is_one_pass_rt_params((AV1_COMP *)CONCAT44(0xffffffff,in_stack_ffffffffffffffd0));
    local_4 = get_refresh_idx(in_RSI,0,(GF_GROUP *)(lVar1 + 400),in_EDX,
                              (uint)((iVar2 != 0 ^ 0xffU) & 1),
                              *(int *)(lVar1 + 0x1df4 + (long)in_EDX * 4));
  }
  return local_4;
}

Assistant:

int av1_calc_refresh_idx_for_intnl_arf(
    AV1_COMP *cpi, RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
    int gf_index) {
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  // Search for the open slot to store the current frame.
  int free_fb_index = get_free_ref_map_index(ref_frame_map_pairs);

  // Use a free slot if available.
  if (free_fb_index != INVALID_IDX) {
    return free_fb_index;
  } else {
    int enable_refresh_skip = !is_one_pass_rt_params(cpi);
    int refresh_idx =
        get_refresh_idx(ref_frame_map_pairs, 0, gf_group, gf_index,
                        enable_refresh_skip, gf_group->display_idx[gf_index]);
    return refresh_idx;
  }
}